

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol.cpp
# Opt level: O0

UCollationResult
ucol_strcollIter_63(UCollator *coll,UCharIterator *sIter,UCharIterator *tIter,UErrorCode *status)

{
  UBool UVar1;
  UCollationResult UVar2;
  Collator *pCVar3;
  UCollationResult result;
  UErrorCode *status_local;
  UCharIterator *tIter_local;
  UCharIterator *sIter_local;
  UCollator *coll_local;
  
  if ((status == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*status), UVar1 != '\0')) {
    return UCOL_EQUAL;
  }
  if ((sIter != (UCharIterator *)0x0) &&
     ((tIter != (UCharIterator *)0x0 && (coll != (UCollator *)0x0)))) {
    pCVar3 = icu_63::Collator::fromUCollator(coll);
    UVar2 = (*(pCVar3->super_UObject)._vptr_UObject[0xc])(pCVar3,sIter,tIter,status);
    return UVar2;
  }
  *status = U_ILLEGAL_ARGUMENT_ERROR;
  return UCOL_EQUAL;
}

Assistant:

U_CAPI UCollationResult U_EXPORT2
ucol_strcollIter( const UCollator    *coll,
                 UCharIterator *sIter,
                 UCharIterator *tIter,
                 UErrorCode         *status)
{
    if(!status || U_FAILURE(*status)) {
        return UCOL_EQUAL;
    }

    UTRACE_ENTRY(UTRACE_UCOL_STRCOLLITER);
    UTRACE_DATA3(UTRACE_VERBOSE, "coll=%p, sIter=%p, tIter=%p", coll, sIter, tIter);

    if(sIter == NULL || tIter == NULL || coll == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        UTRACE_EXIT_VALUE_STATUS(UCOL_EQUAL, *status);
        return UCOL_EQUAL;
    }

    UCollationResult result = Collator::fromUCollator(coll)->compare(*sIter, *tIter, *status);

    UTRACE_EXIT_VALUE_STATUS(result, *status);
    return result;
}